

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall icu_63::Locale::minimizeSubtags(Locale *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t sLength;
  size_t sVar2;
  char *minimizedLocaleID_00;
  EVP_PKEY_CTX *ctx;
  int32_t reslen;
  char *buffer;
  undefined1 local_58 [4];
  int32_t minimizedLocaleIDCapacity;
  CharString minimizedLocaleID;
  UErrorCode *status_local;
  Locale *this_local;
  
  minimizedLocaleID._56_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    CharString::CharString((CharString *)local_58);
    sVar2 = strlen(this->fullName);
    buffer._4_4_ = (int32_t)sVar2;
    while( true ) {
      minimizedLocaleID_00 =
           CharString::getAppendBuffer
                     ((CharString *)local_58,buffer._4_4_,buffer._4_4_,
                      (int32_t *)((long)&buffer + 4),(UErrorCode *)minimizedLocaleID._56_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)minimizedLocaleID._56_8_);
      if (UVar1 != '\0') break;
      sLength = uloc_minimizeSubtags_63
                          (this->fullName,minimizedLocaleID_00,buffer._4_4_,
                           (UErrorCode *)minimizedLocaleID._56_8_);
      if (*(int *)minimizedLocaleID._56_8_ != 0xf) {
        UVar1 = ::U_FAILURE(*(UErrorCode *)minimizedLocaleID._56_8_);
        if (UVar1 == '\0') {
          CharString::append((CharString *)local_58,minimizedLocaleID_00,sLength,
                             (UErrorCode *)minimizedLocaleID._56_8_);
          if (*(int *)minimizedLocaleID._56_8_ == -0x7c) {
            *(undefined4 *)minimizedLocaleID._56_8_ = 0;
          }
          UVar1 = ::U_FAILURE(*(UErrorCode *)minimizedLocaleID._56_8_);
          if (UVar1 == '\0') {
            ctx = (EVP_PKEY_CTX *)CharString::data((CharString *)local_58);
            init(this,ctx);
            UVar1 = isBogus(this);
            if (UVar1 != '\0') {
              *(undefined4 *)minimizedLocaleID._56_8_ = 1;
            }
          }
        }
        break;
      }
      *(undefined4 *)minimizedLocaleID._56_8_ = 0;
      buffer._4_4_ = sLength;
    }
    CharString::~CharString((CharString *)local_58);
  }
  return;
}

Assistant:

void
Locale::minimizeSubtags(UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }

    // Except for a few edge cases (like the empty string, that is minimized to
    // "en__POSIX"), minimized locale ID strings will be either the same length
    // or shorter than their input.
    CharString minimizedLocaleID;
    int32_t minimizedLocaleIDCapacity = static_cast<int32_t>(uprv_strlen(fullName));

    char* buffer;
    int32_t reslen;

    for (;;) {
        buffer = minimizedLocaleID.getAppendBuffer(
                /*minCapacity=*/minimizedLocaleIDCapacity,
                /*desiredCapacityHint=*/minimizedLocaleIDCapacity,
                minimizedLocaleIDCapacity,
                status);

        if (U_FAILURE(status)) {
            return;
        }

        reslen = uloc_minimizeSubtags(
                fullName,
                buffer,
                minimizedLocaleIDCapacity,
                &status);

        if (status != U_BUFFER_OVERFLOW_ERROR) {
            break;
        }

        // Because of the internal minimal buffer size of CharString, I can't
        // think of any input data for which this could possibly ever happen.
        // Maybe it would be better replaced with an assertion instead?
        minimizedLocaleIDCapacity = reslen;
        status = U_ZERO_ERROR;
    }

    if (U_FAILURE(status)) {
        return;
    }

    minimizedLocaleID.append(buffer, reslen, status);
    if (status == U_STRING_NOT_TERMINATED_WARNING) {
        status = U_ZERO_ERROR;  // Terminators provided by CharString.
    }

    if (U_FAILURE(status)) {
        return;
    }

    init(minimizedLocaleID.data(), /*canonicalize=*/FALSE);
    if (isBogus()) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
}